

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

bool __thiscall dg::DGLLVMPointerAnalysis::run(DGLLVMPointerAnalysis *this)

{
  bool bVar1;
  byte bVar2;
  DGLLVMPointerAnalysis *in_stack_00000030;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
                      *)0x1624af);
  if (!bVar1) {
    initialize(in_stack_00000030);
  }
  std::unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>::
  operator->((unique_ptr<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_> *
             )0x1624ce);
  bVar2 = dg::pta::PointerAnalysis::run();
  return (bool)(bVar2 & 1);
}

Assistant:

bool run() override {
        if (!PTA) {
            initialize();
        }
        return PTA->run();
    }